

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagCode.cpp
# Opt level: O2

span<const_slang::DiagCode,_18446744073709551615UL> slang::findDiagsFromOptionName(string_view name)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint64_t uVar9;
  pointer pDVar10;
  byte bVar11;
  __extent_storage<18446744073709551615UL> _Var12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  long lVar16;
  undefined1 auVar17 [16];
  span<const_slang::DiagCode,_18446744073709551615UL> sVar18;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar9 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&optionMap
                     ,&local_40);
  uVar13 = uVar9 >> (optionMap & 0x3f);
  lVar14 = (uVar9 & 0xff) * 4;
  cVar3 = (&UNK_0040eb5c)[lVar14];
  cVar4 = (&UNK_0040eb5d)[lVar14];
  cVar5 = (&UNK_0040eb5e)[lVar14];
  bVar6 = (&UNK_0040eb5f)[lVar14];
  uVar15 = 0;
  do {
    pcVar1 = (char *)(DAT_005afa90 + uVar13 * 0x10);
    bVar11 = pcVar1[0xf];
    auVar17[0] = -(*pcVar1 == cVar3);
    auVar17[1] = -(pcVar1[1] == cVar4);
    auVar17[2] = -(pcVar1[2] == cVar5);
    auVar17[3] = -(pcVar1[3] == bVar6);
    auVar17[4] = -(pcVar1[4] == cVar3);
    auVar17[5] = -(pcVar1[5] == cVar4);
    auVar17[6] = -(pcVar1[6] == cVar5);
    auVar17[7] = -(pcVar1[7] == bVar6);
    auVar17[8] = -(pcVar1[8] == cVar3);
    auVar17[9] = -(pcVar1[9] == cVar4);
    auVar17[10] = -(pcVar1[10] == cVar5);
    auVar17[0xb] = -(pcVar1[0xb] == bVar6);
    auVar17[0xc] = -(pcVar1[0xc] == cVar3);
    auVar17[0xd] = -(pcVar1[0xd] == cVar4);
    auVar17[0xe] = -(pcVar1[0xe] == cVar5);
    auVar17[0xf] = -(bVar11 == bVar6);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar8 != 0) {
      lVar16 = DAT_005afa90 + uVar13 * 0x10;
      lVar14 = DAT_005afa98 + uVar13 * 600;
      do {
        uVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)((ulong)uVar2 * 0x28 + lVar14);
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           &optionMap,&local_40,__y);
        if (bVar7) {
          pDVar10 = (pointer)__y[1]._M_len;
          _Var12._M_extent_value = (long)__y[1]._M_str - (long)pDVar10 >> 2;
          goto LAB_0031957f;
        }
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
      bVar11 = *(byte *)(lVar16 + 0xf);
    }
    pDVar10 = (pointer)0x0;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar9 & 7] & bVar11) == 0) break;
    lVar14 = uVar13 + uVar15;
    uVar15 = uVar15 + 1;
    uVar13 = lVar14 + 1U & DAT_005afa88;
  } while (uVar15 <= DAT_005afa88);
  _Var12._M_extent_value = 0;
LAB_0031957f:
  sVar18._M_extent._M_extent_value = _Var12._M_extent_value;
  sVar18._M_ptr = pDVar10;
  return sVar18;
}

Assistant:

std::span<const DiagCode> findDiagsFromOptionName(std::string_view name) {
    if (auto it = optionMap.find(name); it != optionMap.end())
        return it->second;
    return {};
}